

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBSTest_GetPrefixedBad_Test::~CBSTest_GetPrefixedBad_Test
          (CBSTest_GetPrefixedBad_Test *this)

{
  CBSTest_GetPrefixedBad_Test *this_local;
  
  ~CBSTest_GetPrefixedBad_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CBSTest, GetPrefixedBad) {
  static const uint8_t kData1[] = {2, 1};
  static const uint8_t kData2[] = {0, 2, 1};
  static const uint8_t kData3[] = {0, 0, 2, 1};
  CBS data, prefixed;

  CBS_init(&data, kData1, sizeof(kData1));
  EXPECT_FALSE(CBS_get_u8_length_prefixed(&data, &prefixed));

  CBS_init(&data, kData2, sizeof(kData2));
  EXPECT_FALSE(CBS_get_u16_length_prefixed(&data, &prefixed));

  CBS_init(&data, kData3, sizeof(kData3));
  EXPECT_FALSE(CBS_get_u24_length_prefixed(&data, &prefixed));
}